

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_> * __thiscall
spvtools::val::ValidationState_t::getSampledImageConsumers
          (vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
           *__return_storage_ptr__,ValidationState_t *this,uint32_t sampled_image_id)

{
  ulong uVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  
  (__return_storage_ptr__->
  super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = (this->sampled_image_consumers_)._M_h._M_bucket_count;
  uVar2 = (ulong)sampled_image_id % uVar1;
  p_Var4 = (this->sampled_image_consumers_)._M_h._M_buckets[uVar2];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var4->_M_nxt, p_Var5 = p_Var4,
     *(uint32_t *)&p_Var4->_M_nxt[1]._M_nxt != sampled_image_id)) {
    while (p_Var4 = p_Var3, p_Var3 = p_Var4->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar1 != uVar2) ||
         (p_Var5 = p_Var4, *(uint *)&p_Var3[1]._M_nxt == sampled_image_id)) goto LAB_00672d1e;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_00672d1e:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var5->_M_nxt;
  }
  if (p_Var3 != (_Hash_node_base *)0x0) {
    std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>::
    operator=(__return_storage_ptr__,
              (vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_> *
              )(p_Var3 + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Instruction*> ValidationState_t::getSampledImageConsumers(
    uint32_t sampled_image_id) const {
  std::vector<Instruction*> result;
  auto iter = sampled_image_consumers_.find(sampled_image_id);
  if (iter != sampled_image_consumers_.end()) {
    result = iter->second;
  }
  return result;
}